

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O1

void jpeg_new_colormap(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_decomp_master *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_color_quantizer *pjVar4;
  
  pjVar2 = cinfo->master;
  iVar1 = cinfo->global_state;
  if (iVar1 != 0xcf) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x15;
    (pjVar3->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (((cinfo->quantize_colors != 0) && (cinfo->enable_external_quant != 0)) &&
     (cinfo->colormap != (JSAMPARRAY)0x0)) {
    pjVar4 = *(jpeg_color_quantizer **)&pjVar2[1].is_dummy_pass;
    cinfo->cquantize = pjVar4;
    (*pjVar4->new_color_map)(cinfo);
    pjVar2->is_dummy_pass = 0;
    return;
  }
  pjVar3 = cinfo->err;
  pjVar3->msg_code = 0x2f;
  (*pjVar3->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

GLOBAL(void)
jpeg_new_colormap (j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_BUFIMAGE)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (cinfo->quantize_colors && cinfo->enable_external_quant &&
      cinfo->colormap != NULL) {
    /* Select 2-pass quantizer for external colormap use */
    cinfo->cquantize = master->quantizer_2pass;
    /* Notify quantizer of colormap change */
    (*cinfo->cquantize->new_color_map) (cinfo);
    master->pub.is_dummy_pass = FALSE; /* just in case */
  } else
    ERREXIT(cinfo, JERR_MODE_CHANGE);
}